

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

void __thiscall
FxRandom2::FxRandom2(FxRandom2 *this,FRandom *r,FxExpression *m,FScriptPosition *pos,bool nowarn)

{
  FxIntCast *this_00;
  FxConstant *this_01;
  size_t size;
  bool nowarn_local;
  FScriptPosition *pos_local;
  FxExpression *m_local;
  FRandom *r_local;
  FxRandom2 *this_local;
  
  size = 0x20;
  FxExpression::FxExpression(&this->super_FxExpression,EFX_Random2,pos);
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxRandom2_00a0ab98;
  this->EmitTail = false;
  this->rng = r;
  if (m == (FxExpression *)0x0) {
    this_01 = (FxConstant *)FxExpression::operator_new((FxExpression *)0x38,size);
    FxConstant::FxConstant(this_01,-1,pos);
    this->mask = (FxExpression *)this_01;
  }
  else {
    this_00 = (FxIntCast *)FxExpression::operator_new((FxExpression *)0x38,size);
    FxIntCast::FxIntCast(this_00,m,nowarn,false);
    this->mask = (FxExpression *)this_00;
  }
  (this->super_FxExpression).ValueType = (PType *)TypeSInt32;
  return;
}

Assistant:

FxRandom2::FxRandom2(FRandom *r, FxExpression *m, const FScriptPosition &pos, bool nowarn)
: FxExpression(EFX_Random2, pos)
{
	EmitTail = false;
	rng = r;
	if (m) mask = new FxIntCast(m, nowarn);
	else mask = new FxConstant(-1, pos);
	ValueType = TypeSInt32;
}